

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O2

void anon_unknown.dwarf_7a85::setNonBlocking(TSocketDescriptor *sock)

{
  uint uVar1;
  int iVar2;
  int flag;
  
  uVar1 = fcntl(*sock,3,0);
  fcntl(*sock,4,(ulong)(uVar1 | 0x800));
  iVar2 = setsockopt(*sock,6,1,&flag,4);
  if (iVar2 != 0) {
    fwrite("Failed to set non-blocking socket\n",0x22,1,_stderr);
  }
  return;
}

Assistant:

void setNonBlocking(TSocketDescriptor & sock) {
#ifdef _WIN32
        unsigned long nonblocking = 1;
        ioctlsocket(sock, FIONBIO, &nonblocking);
#else
        int flags;
        flags = fcntl(sock, F_GETFL, 0);
        fcntl(sock, F_SETFL, flags | O_NONBLOCK);

        int flag = 1;
        int result = setsockopt(sock,            /* socket affected */
                                IPPROTO_TCP,     /* set option at TCP level */
                                TCP_NODELAY,     /* name of option */
                                (char *) &flag,  /* the cast is historical cruft */
                                sizeof(int));    /* length of option value */
        if (result != 0) {
            fprintf(stderr, "Failed to set non-blocking socket\n");
        }
#endif
    }